

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O1

int check_matrix_entry(SUNMatrix A,realtype val,realtype tol)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  lVar2 = SUNDenseMatrix_Data();
  lVar3 = SUNDenseMatrix_LData(A);
  uVar6 = 0;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      dVar1 = *(double *)(lVar2 + lVar4 * 8);
      if (NAN(dVar1)) {
        uVar5 = 1;
      }
      else {
        uVar5 = (uint)(tol < ABS((dVar1 - val) / val));
      }
      uVar6 = uVar6 + uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    uVar6 = (uint)(uVar6 != 0);
  }
  if ((char)uVar6 != '\0') {
    puts("Check_matrix_entry failures:");
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        dVar1 = *(double *)(lVar2 + lVar4 * 8);
        if ((NAN(dVar1)) || (tol < ABS((dVar1 - val) / val))) {
          printf("  Adata[%ld] = %g != %g (err = %g)\n",dVar1,val,ABS(dVar1 - val),lVar4);
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  return uVar6;
}

Assistant:

int check_matrix_entry(SUNMatrix A, realtype val, realtype tol)
{
  int failure = 0;
  realtype *Adata;
  sunindextype Aldata;
  sunindextype i;
  
  /* get data pointer */
  Adata = SUNDenseMatrix_Data(A);

  /* compare data */
  Aldata = SUNDenseMatrix_LData(A);
  for(i=0; i < Aldata; i++){
    failure += FNEQ(Adata[i], val, tol);
  }

  if (failure > ZERO) {
    printf("Check_matrix_entry failures:\n");
    for(i=0; i < Aldata; i++)
      if (FNEQ(Adata[i], val, tol) != 0)
        printf("  Adata[%ld] = %g != %g (err = %g)\n", (long int) i,
               Adata[i], val, SUNRabs(Adata[i]-val));
  }
  
  if (failure > ZERO)
    return(1);
  else
    return(0);
}